

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

void ssl_bitmask_set(uchar *mask,size_t offset,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  bool bVar7;
  
  uVar3 = (uint)offset & 7;
  sVar1 = len;
  if ((offset & 7) != 0) {
    uVar5 = offset >> 3;
    uVar2 = (ulong)(8 - uVar3);
    sVar1 = len - uVar2;
    if (len < uVar2 || sVar1 == 0) {
      if (len == 0) {
        return;
      }
      bVar6 = mask[uVar5];
      iVar4 = 8 - (uVar3 + (int)len);
      sVar1 = len;
      do {
        bVar6 = bVar6 | (byte)(1 << ((byte)iVar4 & 0x1f));
        iVar4 = iVar4 + 1;
        sVar1 = sVar1 - 1;
      } while (sVar1 != 0);
      mask[uVar5] = bVar6;
      sVar1 = 0;
    }
    else {
      offset = offset + uVar2;
      bVar6 = mask[uVar5];
      uVar3 = uVar3 ^ 7;
      do {
        bVar6 = bVar6 | (byte)(1 << ((byte)uVar3 & 0x1f));
        bVar7 = uVar3 != 0;
        uVar3 = uVar3 - 1;
      } while (bVar7);
      mask[uVar5] = bVar6;
    }
    if (len <= uVar2) {
      return;
    }
  }
  if ((sVar1 & 7) != 0) {
    uVar2 = offset + sVar1 >> 3;
    bVar6 = mask[uVar2];
    iVar4 = 8 - ((uint)sVar1 & 7);
    do {
      bVar6 = bVar6 | (byte)(1 << ((byte)iVar4 & 0x1f));
      iVar4 = iVar4 + 1;
    } while (iVar4 != 8);
    mask[uVar2] = bVar6;
  }
  memset(mask + (offset >> 3),0xff,sVar1 >> 3);
  return;
}

Assistant:

static void ssl_bitmask_set(unsigned char *mask, size_t offset, size_t len)
{
    unsigned int start_bits, end_bits;

    start_bits = 8 - (offset % 8);
    if (start_bits != 8) {
        size_t first_byte_idx = offset / 8;

        /* Special case */
        if (len <= start_bits) {
            for (; len != 0; len--) {
                mask[first_byte_idx] |= 1 << (start_bits - len);
            }

            /* Avoid potential issues with offset or len becoming invalid */
            return;
        }

        offset += start_bits; /* Now offset % 8 == 0 */
        len -= start_bits;

        for (; start_bits != 0; start_bits--) {
            mask[first_byte_idx] |= 1 << (start_bits - 1);
        }
    }

    end_bits = len % 8;
    if (end_bits != 0) {
        size_t last_byte_idx = (offset + len) / 8;

        len -= end_bits; /* Now len % 8 == 0 */

        for (; end_bits != 0; end_bits--) {
            mask[last_byte_idx] |= 1 << (8 - end_bits);
        }
    }

    memset(mask + offset / 8, 0xFF, len / 8);
}